

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btKinematicCharacterController.cpp
# Opt level: O3

void __thiscall
btKinematicCharacterController::stepForwardAndStrafe
          (btKinematicCharacterController *this,btCollisionWorld *collisionWorld,btVector3 *walkMove
          )

{
  undefined8 uVar1;
  undefined8 uVar2;
  btBroadphaseProxy *pbVar3;
  undefined1 auVar4 [16];
  btScalar bVar5;
  int iVar6;
  float extraout_XMM0_Da;
  btScalar tangentMag;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  btTransform end;
  btTransform start;
  ConvexResultCallback local_128;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  btVector3 local_f8 [2];
  undefined8 local_d8;
  btPairCachingGhostObject *local_d0;
  undefined1 local_c8 [16];
  undefined4 local_b8;
  btTransform local_b0;
  btTransform local_70;
  
  uVar1 = *(undefined8 *)(this->m_currentPosition).m_floats;
  auVar4._4_4_ = (float)((ulong)*(undefined8 *)walkMove->m_floats >> 0x20) +
                 (float)((ulong)uVar1 >> 0x20);
  auVar4._0_4_ = (float)*(undefined8 *)walkMove->m_floats + (float)uVar1;
  auVar4._8_4_ = (this->m_currentPosition).m_floats[2] + walkMove->m_floats[2];
  auVar4._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_targetPosition).m_floats = auVar4;
  local_70.m_basis.m_el[0].m_floats[0] = 1.0;
  local_70.m_basis.m_el[0].m_floats[1] = 0.0;
  local_70.m_basis.m_el[0].m_floats[2] = 0.0;
  local_70.m_basis.m_el[0].m_floats[3] = 0.0;
  local_70.m_basis.m_el[1].m_floats[0] = 0.0;
  local_70.m_basis.m_el[1].m_floats[1] = 1.0;
  local_70.m_basis.m_el[1].m_floats[2] = 0.0;
  local_70.m_basis.m_el[1].m_floats[3] = 0.0;
  local_70.m_basis.m_el[2].m_floats[0] = 0.0;
  local_70.m_basis.m_el[2].m_floats[1] = 0.0;
  local_70.m_basis.m_el[2].m_floats[2] = 1.0;
  local_70.m_basis.m_el[2].m_floats[3] = 0.0;
  local_b0.m_basis.m_el[0].m_floats[0] = 1.0;
  local_b0.m_basis.m_el[0].m_floats[1] = 0.0;
  local_b0.m_basis.m_el[0].m_floats[2] = 0.0;
  local_b0.m_basis.m_el[0].m_floats[3] = 0.0;
  local_b0.m_basis.m_el[1].m_floats[0] = 0.0;
  local_b0.m_basis.m_el[1].m_floats[1] = 1.0;
  local_b0.m_basis.m_el[1].m_floats[2] = 0.0;
  local_b0.m_basis.m_el[1].m_floats[3] = 0.0;
  local_b0.m_basis.m_el[2].m_floats[0] = 0.0;
  local_b0.m_basis.m_el[2].m_floats[1] = 0.0;
  local_b0.m_basis.m_el[2].m_floats[2] = 1.0;
  local_b0.m_basis.m_el[2].m_floats[3] = 0.0;
  fVar8 = 1.0;
  iVar6 = -0xb;
  do {
    iVar6 = iVar6 + 1;
    if (iVar6 == 0) {
      return;
    }
    local_70.m_origin.m_floats._0_8_ = *(undefined8 *)(this->m_currentPosition).m_floats;
    local_70.m_origin.m_floats._8_8_ = *(undefined8 *)((this->m_currentPosition).m_floats + 2);
    local_b0.m_origin.m_floats._0_8_ = *(undefined8 *)(this->m_targetPosition).m_floats;
    local_b0.m_origin.m_floats._8_8_ = *(undefined8 *)((this->m_targetPosition).m_floats + 2);
    uVar1 = *(undefined8 *)(this->m_currentPosition).m_floats;
    uVar2 = *(undefined8 *)(this->m_targetPosition).m_floats;
    local_d0 = this->m_ghostObject;
    local_128.m_closestHitFraction = 1.0;
    local_d8 = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_118 = 0;
    uStack_110 = 0;
    local_128._vptr_ConvexResultCallback = (_func_int **)&PTR__ConvexResultCallback_0021feb8;
    local_c8._4_4_ = (float)((ulong)uVar1 >> 0x20) - (float)((ulong)uVar2 >> 0x20);
    local_c8._0_4_ = (float)uVar1 - (float)uVar2;
    local_c8._8_4_ = (this->m_currentPosition).m_floats[2] - (this->m_targetPosition).m_floats[2];
    local_c8._12_4_ = 0;
    local_b8 = 0;
    pbVar3 = (local_d0->super_btGhostObject).super_btCollisionObject.m_broadphaseHandle;
    local_128.m_collisionFilterGroup = pbVar3->m_collisionFilterGroup;
    local_128.m_collisionFilterMask = pbVar3->m_collisionFilterMask;
    (*(this->m_convexShape->super_btCollisionShape)._vptr_btCollisionShape[0xc])();
    (*(this->m_convexShape->super_btCollisionShape)._vptr_btCollisionShape[0xb])
              (this->m_addedMargin + extraout_XMM0_Da);
    if (this->m_useGhostObjectSweepTest == true) {
      btGhostObject::convexSweepTest
                (&this->m_ghostObject->super_btGhostObject,this->m_convexShape,&local_70,&local_b0,
                 &local_128,(collisionWorld->m_dispatchInfo).m_allowedCcdPenetration);
    }
    else {
      btCollisionWorld::convexSweepTest
                (collisionWorld,this->m_convexShape,&local_70,&local_b0,&local_128,
                 (collisionWorld->m_dispatchInfo).m_allowedCcdPenetration);
    }
    (*(this->m_convexShape->super_btCollisionShape)._vptr_btCollisionShape[0xb])(extraout_XMM0_Da);
    bVar5 = local_128.m_closestHitFraction;
    if (1.0 <= local_128.m_closestHitFraction) {
      uVar1 = *(undefined8 *)((this->m_targetPosition).m_floats + 2);
      *(undefined8 *)(this->m_currentPosition).m_floats =
           *(undefined8 *)(this->m_targetPosition).m_floats;
      *(undefined8 *)((this->m_currentPosition).m_floats + 2) = uVar1;
    }
    else {
      updateTargetPositionBasedOnCollision(this,local_f8,tangentMag,1.0);
      fVar7 = (this->m_targetPosition).m_floats[0] - (this->m_currentPosition).m_floats[0];
      fVar9 = (this->m_targetPosition).m_floats[1] - (this->m_currentPosition).m_floats[1];
      fVar10 = (this->m_targetPosition).m_floats[2] - (this->m_currentPosition).m_floats[2];
      fVar11 = fVar10 * fVar10 + fVar7 * fVar7 + fVar9 * fVar9;
      if (fVar11 <= 1.1920929e-07) {
        return;
      }
      fVar11 = 1.0 / SQRT(fVar11);
      if (fVar10 * fVar11 * (this->m_normalizedDirection).m_floats[2] +
          fVar7 * fVar11 * (this->m_normalizedDirection).m_floats[0] +
          fVar9 * fVar11 * (this->m_normalizedDirection).m_floats[1] <= 0.0) {
        return;
      }
    }
    fVar8 = fVar8 - bVar5;
    if (fVar8 <= 0.01) {
      return;
    }
  } while( true );
}

Assistant:

void btKinematicCharacterController::stepForwardAndStrafe ( btCollisionWorld* collisionWorld, const btVector3& walkMove)
{
	// printf("m_normalizedDirection=%f,%f,%f\n",
	// 	m_normalizedDirection[0],m_normalizedDirection[1],m_normalizedDirection[2]);
	// phase 2: forward and strafe
	btTransform start, end;
	m_targetPosition = m_currentPosition + walkMove;

	start.setIdentity ();
	end.setIdentity ();

	btScalar fraction = 1.0;
	btScalar distance2 = (m_currentPosition-m_targetPosition).length2();
//	printf("distance2=%f\n",distance2);

	if (m_touchingContact)
	{
		if (m_normalizedDirection.dot(m_touchingNormal) > btScalar(0.0))
		{
			//interferes with step movement
			//updateTargetPositionBasedOnCollision (m_touchingNormal);
		}
	}

	int maxIter = 10;

	while (fraction > btScalar(0.01) && maxIter-- > 0)
	{
		start.setOrigin (m_currentPosition);
		end.setOrigin (m_targetPosition);
		btVector3 sweepDirNegative(m_currentPosition - m_targetPosition);

		btKinematicClosestNotMeConvexResultCallback callback (m_ghostObject, sweepDirNegative, btScalar(0.0));
		callback.m_collisionFilterGroup = getGhostObject()->getBroadphaseHandle()->m_collisionFilterGroup;
		callback.m_collisionFilterMask = getGhostObject()->getBroadphaseHandle()->m_collisionFilterMask;


		btScalar margin = m_convexShape->getMargin();
		m_convexShape->setMargin(margin + m_addedMargin);


		if (m_useGhostObjectSweepTest)
		{
			m_ghostObject->convexSweepTest (m_convexShape, start, end, callback, collisionWorld->getDispatchInfo().m_allowedCcdPenetration);
		} else
		{
			collisionWorld->convexSweepTest (m_convexShape, start, end, callback, collisionWorld->getDispatchInfo().m_allowedCcdPenetration);
		}

		m_convexShape->setMargin(margin);


		fraction -= callback.m_closestHitFraction;

		if (callback.hasHit())
		{
			// we moved only a fraction
			//btScalar hitDistance;
			//hitDistance = (callback.m_hitPointWorld - m_currentPosition).length();

//			m_currentPosition.setInterpolate3 (m_currentPosition, m_targetPosition, callback.m_closestHitFraction);

			updateTargetPositionBasedOnCollision (callback.m_hitNormalWorld);
			btVector3 currentDir = m_targetPosition - m_currentPosition;
			distance2 = currentDir.length2();
			if (distance2 > SIMD_EPSILON)
			{
				currentDir.normalize();
				/* See Quake2: "If velocity is against original velocity, stop ead to avoid tiny oscilations in sloping corners." */
				if (currentDir.dot(m_normalizedDirection) <= btScalar(0.0))
				{
					break;
				}
			} else
			{
//				printf("currentDir: don't normalize a zero vector\n");
				break;
			}

		} else {
			// we moved whole way
			m_currentPosition = m_targetPosition;
		}

	//	if (callback.m_closestHitFraction == 0.f)
	//		break;

	}
}